

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v11::detail::do_format_base2e<char,unsigned_int>
                 (int base_bits,char *out,uint value,int size,bool upper)

{
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  uint uVar5;
  undefined7 in_register_00000081;
  
  pcVar2 = out + size;
  pcVar3 = "0123456789abcdef";
  if ((int)CONCAT71(in_register_00000081,upper) != 0) {
    pcVar3 = "0123456789ABCDEF";
  }
  do {
    uVar5 = value & ~(-1 << ((byte)base_bits & 0x1f));
    if (base_bits < 4) {
      cVar4 = (char)uVar5 + '0';
    }
    else {
      cVar4 = pcVar3[uVar5];
    }
    pcVar2[-1] = cVar4;
    pcVar2 = pcVar2 + -1;
    bVar1 = (byte)base_bits & 0x1f;
    uVar5 = value >> bVar1;
    value = value >> bVar1;
  } while (uVar5 != 0);
  return pcVar2;
}

Assistant:

FMT_CONSTEXPR auto do_format_base2e(int base_bits, Char* out, UInt value,
                                    int size, bool upper = false) -> Char* {
  out += size;
  do {
    const char* digits = upper ? "0123456789ABCDEF" : "0123456789abcdef";
    unsigned digit = static_cast<unsigned>(value & ((1 << base_bits) - 1));
    *--out = static_cast<Char>(base_bits < 4 ? static_cast<char>('0' + digit)
                                             : digits[digit]);
  } while ((value >>= base_bits) != 0);
  return out;
}